

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UChar *buffer,int32_t buffLength,int32_t buffCapacity)

{
  char16_t *pcVar1;
  ushort uVar2;
  long lVar3;
  int16_t iVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar2 & 0x10) == 0) {
    if (buffer == (UChar *)0x0) {
      if ((uVar2 & 4) != 0) {
        LOCK();
        pcVar1 = (this->fUnion).fFields.fArray + -2;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        UNLOCK();
        if (*(int *)pcVar1 == 0) {
          uprv_free_63((this->fUnion).fFields.fArray + -2);
        }
      }
      (this->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    else if (((buffCapacity < buffLength) || (buffLength < -1)) || (buffCapacity < 0)) {
      setToBogus(this);
    }
    else {
      if (buffLength == -1) {
        pUVar6 = buffer;
        if (buffCapacity != 0) {
          lVar3 = (ulong)(uint)buffCapacity * 2;
          pUVar5 = buffer;
          do {
            pUVar6 = pUVar5;
            if (*pUVar5 == L'\0') break;
            pUVar5 = pUVar5 + 1;
            lVar3 = lVar3 + -2;
            pUVar6 = buffer + (uint)buffCapacity;
          } while (lVar3 != 0);
        }
        buffLength = (int32_t)((ulong)((long)pUVar6 - (long)buffer) >> 1);
      }
      if ((uVar2 & 4) != 0) {
        LOCK();
        pcVar1 = (this->fUnion).fFields.fArray + -2;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        UNLOCK();
        if (*(int *)pcVar1 == 0) {
          uprv_free_63((this->fUnion).fFields.fArray + -2);
        }
      }
      if (buffLength < 0x400) {
        iVar4 = (int16_t)(buffLength << 5);
      }
      else {
        (this->fUnion).fFields.fLength = buffLength;
        iVar4 = -0x20;
      }
      (this->fUnion).fStackFields.fLengthAndFlags = iVar4;
      (this->fUnion).fFields.fArray = buffer;
      (this->fUnion).fFields.fCapacity = buffCapacity;
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UChar *buffer,
                     int32_t buffLength,
                     int32_t buffCapacity) {
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  if(buffer == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if(buffLength < -1 || buffCapacity < 0 || buffLength > buffCapacity) {
    setToBogus();
    return *this;
  } else if(buffLength == -1) {
    // buffLength = u_strlen(buff); but do not look beyond buffCapacity
    const UChar *p = buffer, *limit = buffer + buffCapacity;
    while(p != limit && *p != 0) {
      ++p;
    }
    buffLength = (int32_t)(p - buffer);
  }

  releaseArray();

  fUnion.fFields.fLengthAndFlags = kWritableAlias;
  setArray(buffer, buffLength, buffCapacity);
  return *this;
}